

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Flt::render(V2Flt *this,float *dest,float *src,int nsamples,int step)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ulong uVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  switch(this->mode & 7) {
  case 0:
    if (dest == src) {
      return;
    }
    memmove(dest,src,(long)nsamples << 2);
    return;
  case 1:
    fVar16 = (this->lrc).l;
    fVar20 = (this->lrc).b;
    if (0 < nsamples) {
      uVar13 = (ulong)(uint)nsamples;
      lVar14 = 0;
      do {
        uVar6 = this->cfreq;
        uVar11 = this->res;
        fVar16 = fVar16 + (float)uVar6 * fVar20 + -3.8146973e-06;
        fVar18 = *(float *)((long)src + lVar14) + 3.8146973e-06;
        fVar20 = ((fVar18 - (float)uVar11 * fVar20) - fVar16) * (float)uVar6 + fVar20;
        fVar16 = fVar20 * (float)uVar6 + fVar16;
        fVar20 = ((-fVar20 * (float)uVar11 + fVar18) - fVar16) * (float)uVar6 + fVar20;
        *(float *)((long)dest + lVar14) = fVar16;
        lVar14 = lVar14 + (long)step * 4;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    break;
  case 2:
    fVar16 = (this->lrc).l;
    fVar20 = (this->lrc).b;
    if (0 < nsamples) {
      uVar13 = (ulong)(uint)nsamples;
      lVar14 = 0;
      do {
        uVar4 = this->cfreq;
        uVar9 = this->res;
        fVar16 = fVar16 + (float)uVar4 * fVar20 + -3.8146973e-06;
        fVar18 = *(float *)((long)src + lVar14) + 3.8146973e-06;
        fVar20 = ((fVar18 - (float)uVar9 * fVar20) - fVar16) * (float)uVar4 + fVar20;
        fVar16 = fVar20 * (float)uVar4 + fVar16;
        fVar20 = ((-fVar20 * (float)uVar9 + fVar18) - fVar16) * (float)uVar4 + fVar20;
        *(float *)((long)dest + lVar14) = fVar20;
        lVar14 = lVar14 + (long)step * 4;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    break;
  case 3:
    fVar16 = (this->lrc).l;
    fVar20 = (this->lrc).b;
    if (0 < nsamples) {
      uVar13 = (ulong)(uint)nsamples;
      lVar14 = 0;
      do {
        uVar5 = this->cfreq;
        uVar10 = this->res;
        fVar16 = fVar16 + (float)uVar5 * fVar20 + -3.8146973e-06;
        fVar18 = *(float *)((long)src + lVar14) + 3.8146973e-06;
        fVar20 = ((fVar18 - (float)uVar10 * fVar20) - fVar16) * (float)uVar5 + fVar20;
        fVar16 = fVar20 * (float)uVar5 + fVar16;
        fVar18 = (-fVar20 * (float)uVar10 + fVar18) - fVar16;
        fVar20 = (float)uVar5 * fVar18 + fVar20;
        *(float *)((long)dest + lVar14) = fVar18;
        lVar14 = lVar14 + (long)step * 4;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    (this->lrc).l = fVar16;
    (this->lrc).b = fVar20;
    return;
  case 4:
    fVar16 = (this->lrc).l;
    fVar20 = (this->lrc).b;
    if (0 < nsamples) {
      uVar13 = (ulong)(uint)nsamples;
      lVar14 = 0;
      do {
        uVar3 = this->cfreq;
        uVar8 = this->res;
        fVar16 = fVar16 + (float)uVar3 * fVar20 + -3.8146973e-06;
        fVar18 = *(float *)((long)src + lVar14) + 3.8146973e-06;
        fVar20 = ((fVar18 - (float)uVar8 * fVar20) - fVar16) * (float)uVar3 + fVar20;
        fVar16 = fVar20 * (float)uVar3 + fVar16;
        fVar18 = (-fVar20 * (float)uVar8 + fVar18) - fVar16;
        fVar20 = (float)uVar3 * fVar18 + fVar20;
        *(float *)((long)dest + lVar14) = fVar18 + fVar16;
        lVar14 = lVar14 + (long)step * 4;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    goto LAB_0010b263;
  case 5:
    fVar16 = (this->lrc).l;
    fVar20 = (this->lrc).b;
    if (0 < nsamples) {
      uVar13 = (ulong)(uint)nsamples;
      lVar14 = 0;
      do {
        uVar7 = this->cfreq;
        uVar12 = this->res;
        fVar16 = fVar16 + (float)uVar7 * fVar20 + -3.8146973e-06;
        fVar18 = *(float *)((long)src + lVar14) + 3.8146973e-06;
        fVar20 = ((fVar18 - (float)uVar12 * fVar20) - fVar16) * (float)uVar7 + fVar20;
        fVar16 = fVar20 * (float)uVar7 + fVar16;
        fVar18 = (-fVar20 * (float)uVar12 + fVar18) - fVar16;
        fVar20 = (float)uVar7 * fVar18 + fVar20;
        *(float *)((long)dest + lVar14) = fVar16 + fVar20 + fVar18;
        lVar14 = lVar14 + (long)step * 4;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
LAB_0010b263:
    (this->lrc).l = fVar16;
    (this->lrc).b = fVar20;
    return;
  case 6:
    fVar16 = (this->moog).b[0];
    fVar20 = (this->moog).b[1];
    fVar18 = (this->moog).b[2];
    fVar22 = (this->moog).b[3];
    fVar21 = (this->moog).b[4];
    if (0 < nsamples) {
      uVar13 = (ulong)(uint)nsamples;
      lVar14 = 0;
      fVar15 = fVar16;
      do {
        fVar16 = *(float *)((long)src + lVar14);
        fVar1 = this->moogf;
        fVar2 = this->moogp;
        fVar19 = (((fVar16 + 3.8146973e-06) - this->moogq * fVar21) + fVar15) * fVar2 -
                 fVar1 * fVar20;
        fVar17 = (fVar20 + fVar19) * fVar2 - fVar1 * fVar18;
        fVar15 = (fVar18 + fVar17) * fVar2 - fVar1 * fVar22;
        fVar20 = (fVar22 + fVar15) * fVar2 - fVar21 * fVar1;
        fVar21 = (fVar20 - fVar20 * fVar20 * fVar20 * 0.16666667) + -3.8146973e-06 + -3.8146973e-06;
        fVar20 = (((fVar16 + 3.8146973e-06) - this->moogq * fVar21) + fVar16) * fVar2 -
                 fVar1 * fVar19;
        fVar18 = (fVar19 + fVar20) * fVar2 - fVar1 * fVar17;
        fVar22 = (fVar17 + fVar18) * fVar2 - fVar1 * fVar15;
        fVar21 = (fVar15 + fVar22) * fVar2 - fVar21 * fVar1;
        fVar21 = (fVar21 - fVar21 * fVar21 * fVar21 * 0.16666667) + -3.8146973e-06;
        *(float *)((long)dest + lVar14) = fVar21;
        fVar21 = fVar21 + -3.8146973e-06;
        lVar14 = lVar14 + (long)step * 4;
        uVar13 = uVar13 - 1;
        fVar15 = fVar16;
      } while (uVar13 != 0);
    }
    (this->moog).b[0] = fVar16;
    (this->moog).b[1] = fVar20;
    (this->moog).b[2] = fVar18;
    goto LAB_0010b2cb;
  case 7:
    fVar16 = (this->moog).b[0];
    fVar20 = (this->moog).b[1];
    fVar18 = (this->moog).b[2];
    fVar22 = (this->moog).b[3];
    fVar21 = (this->moog).b[4];
    if (0 < nsamples) {
      uVar13 = (ulong)(uint)nsamples;
      lVar14 = 0;
      fVar15 = fVar16;
      do {
        fVar16 = *(float *)((long)src + lVar14);
        fVar1 = this->moogf;
        fVar2 = this->moogp;
        fVar17 = (((fVar16 + 3.8146973e-06) - this->moogq * fVar21) + fVar15) * fVar2 -
                 fVar1 * fVar20;
        fVar19 = (fVar20 + fVar17) * fVar2 - fVar1 * fVar18;
        fVar15 = (fVar18 + fVar19) * fVar2 - fVar1 * fVar22;
        fVar20 = (fVar22 + fVar15) * fVar2 - fVar21 * fVar1;
        fVar21 = (fVar20 - fVar20 * fVar20 * fVar20 * 0.16666667) + -3.8146973e-06 + -3.8146973e-06;
        fVar20 = (((fVar16 + 3.8146973e-06) - this->moogq * fVar21) + fVar16) * fVar2 -
                 fVar1 * fVar17;
        fVar18 = (fVar17 + fVar20) * fVar2 - fVar1 * fVar19;
        fVar22 = (fVar19 + fVar18) * fVar2 - fVar1 * fVar15;
        fVar21 = (fVar15 + fVar22) * fVar2 - fVar21 * fVar1;
        fVar15 = (fVar21 - fVar21 * fVar21 * fVar21 * 0.16666667) + -3.8146973e-06;
        fVar21 = fVar15 + -3.8146973e-06;
        *(float *)((long)dest + lVar14) = fVar16 - fVar15;
        lVar14 = lVar14 + (long)step * 4;
        uVar13 = uVar13 - 1;
        fVar15 = fVar16;
      } while (uVar13 != 0);
    }
    (this->moog).b[0] = fVar16;
    (this->moog).b[1] = fVar20;
    (this->moog).b[2] = fVar18;
LAB_0010b2cb:
    (this->moog).b[3] = fVar22;
    (this->moog).b[4] = fVar21;
    return;
  }
  (this->lrc).l = fVar16;
  (this->lrc).b = fVar20;
  return;
}

Assistant:

void render(float *dest, const float *src, int nsamples, int step=1)
    {
        V2LRC flt;
        V2Moog m;

        switch (mode & 7)
        {
        case BYPASS:
            COVER("VCF bypass");
            // @@@BUG ignores step? this is wrong but I suppose this
            // never gets hit for stereo case.
            if (dest != src)
                memmove(dest, src, nsamples * sizeof(float));
            break;

        case LOW:
            COVER("VCF low");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l;
            }
            lrc = flt;
            break;

        case BAND:
            COVER("VCF band");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.b;
            }
            lrc = flt;
            break;

        case HIGH:
            COVER("VCF high");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = h;
            }
            lrc = flt;
            break;

        case NOTCH:
            COVER("VCF notch");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l + h;
            }
            lrc = flt;
            break;

        case ALL:
            COVER("VCF all");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l + flt.b + h;
            }
            lrc = flt;
            break;

        case MOOGL:
            COVER("VCF moog low");
            // Moog filters are 2x oversampled, so run filter twice.
            m = moog;
            for (int i=0; i < nsamples; i++)
            {
                float in = src[i*step];
                m.step(in, moogf, moogp, moogq);
                dest[i*step] = m.step(in, moogf, moogp, moogq);
            }
            moog = m;
            break;

        case MOOGH:
            COVER("VCF moog high");
            m = moog;
            for (int i=0; i < nsamples; i++)
            {
                float in = src[i*step];
                m.step(in, moogf, moogp, moogq);
                dest[i*step] = in - m.step(in, moogf, moogp, moogq);
            }
            moog = m;
            break;
        }

        DEBUG_PLOT_STRIDED(this, dest, step, nsamples);
    }